

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O2

char * luaL_findtable(lua_State *L,int idx,char *fname,int szhint)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  lua_pushvalue(L,idx);
  do {
    pcVar2 = strchr(fname,0x2e);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(fname);
      pcVar2 = fname + sVar3;
    }
    lua_pushlstring(L,fname,(long)pcVar2 - (long)fname);
    lua_rawget(L,-2);
    iVar1 = lua_type(L,-1);
    if (iVar1 == 0) {
      lua_settop(L,-2);
      iVar1 = szhint;
      if (*pcVar2 == '.') {
        iVar1 = 1;
      }
      lua_createtable(L,0,iVar1);
      lua_pushlstring(L,fname,(long)pcVar2 - (long)fname);
      lua_pushvalue(L,-2);
      lua_settable(L,-4);
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 5) {
        lua_settop(L,-3);
        return fname;
      }
    }
    lua_remove(L,-2);
    fname = pcVar2 + 1;
  } while (*pcVar2 == '.');
  return (char *)0x0;
}

Assistant:

LUALIB_API const char *luaL_findtable(lua_State *L, int idx,
				      const char *fname, int szhint)
{
  const char *e;
  lua_pushvalue(L, idx);
  do {
    e = strchr(fname, '.');
    if (e == NULL) e = fname + strlen(fname);
    lua_pushlstring(L, fname, (size_t)(e - fname));
    lua_rawget(L, -2);
    if (lua_isnil(L, -1)) {  /* no such field? */
      lua_pop(L, 1);  /* remove this nil */
      lua_createtable(L, 0, (*e == '.' ? 1 : szhint)); /* new table for field */
      lua_pushlstring(L, fname, (size_t)(e - fname));
      lua_pushvalue(L, -2);
      lua_settable(L, -4);  /* set new table into field */
    } else if (!lua_istable(L, -1)) {  /* field has a non-table value? */
      lua_pop(L, 2);  /* remove table and value */
      return fname;  /* return problematic part of the name */
    }
    lua_remove(L, -2);  /* remove previous table */
    fname = e + 1;
  } while (*e == '.');
  return NULL;
}